

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QRhiBufferData>::emplace_back_impl<QRhiBufferData_const&>
          (QVLABase<QRhiBufferData> *this,qsizetype prealloc,void *array,QRhiBufferData *args)

{
  QVLABase<QRhiBufferData> *this_00;
  QVLABase<QRhiBufferData> *pQVar1;
  QRhiBufferData *pQVar2;
  qsizetype in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QRhiBufferData> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QRhiBufferData> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QRhiBufferData> *)this_01,in_RSI,in_RDX,in_RCX);
  }
  end(this_00);
  pQVar2 = q20::construct_at<QRhiBufferData,QRhiBufferData_const&,void>
                     ((QRhiBufferData *)this_00,(QRhiBufferData *)in_RDI);
  in_RDI->s = in_RDI->s + 1;
  return pQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }